

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,void **vtt,string *name,bool quiet,Encoding encoding)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  codecvt *this_00;
  undefined2 local_74;
  undefined1 local_72;
  char magic [3];
  locale local_68;
  locale local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Encoding local_28;
  byte local_21;
  Encoding encoding_local;
  bool quiet_local;
  string *name_local;
  void **vtt_local;
  cmGeneratedFileStream *this_local;
  
  local_28 = encoding;
  local_21 = quiet;
  _encoding_local = name;
  name_local = (string *)vtt;
  vtt_local = (void **)this;
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream +
            (long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]) = vtt[5];
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(this,(char *)(vtt + 1),_Var2);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream +
            (long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]) = vtt[5];
  bVar1 = std::ios::operator!((ios *)((long)&(this->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if (((bVar1 & 1) != 0) && ((local_21 & 1) == 0)) {
    std::operator+(&local_58,"Cannot open file for write: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_ofstream).field_0x138);
    cmSystemTools::Error(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    cmSystemTools::ReportLastSystemError("");
  }
  if (local_28 != None) {
    std::ios_base::getloc((ios_base *)&stack0xffffffffffffff90);
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,local_28);
    std::locale::locale<codecvt>(&local_68,(locale *)&stack0xffffffffffffff90,this_00);
    std::ios::imbue(&local_60);
    std::locale::~locale(&local_60);
    std::locale::~locale(&local_68);
    std::locale::~locale((locale *)&stack0xffffffffffffff90);
  }
  if (local_28 == UTF8_WITH_BOM) {
    local_72 = 0xbf;
    local_74 = 0xbbef;
    std::ostream::write((char *)this,(long)&local_74);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(std::string const& name,
                                             bool quiet, Encoding encoding)
  : cmGeneratedFileStreamBase(name)
  , Stream(this->TempName.c_str()) // NOLINT(cmake-use-cmsys-fstream)
{
  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: " + this->TempName);
    cmSystemTools::ReportLastSystemError("");
  }
#ifndef CMAKE_BOOTSTRAP
  if (encoding != codecvt::None) {
    this->imbue(std::locale(this->getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
  if (encoding == codecvt::UTF8_WITH_BOM) {
    // Write the BOM encoding header into the file
    char magic[] = { static_cast<char>(0xEF), static_cast<char>(0xBB),
                     static_cast<char>(0xBF) };
    this->write(magic, 3);
  }
}